

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool lookahead_0(ParserContext *context)

{
  _Bool _Var1;
  TokenQueue *token_queue;
  Token *token;
  
  token_queue = TokenQueue_new();
LAB_0011e95a:
  do {
    token = read_token(context);
    TokenQueue_add(token_queue,token);
    if (token->matched_type != Token_EOF) {
      _Var1 = handle_external_error(context,token,context->token_matcher->match_ScenarioLine);
      if (_Var1) {
        _Var1 = true;
        goto LAB_0011e9e8;
      }
      if ((token->matched_type != Token_EOF) &&
         ((_Var1 = handle_external_error(context,token,context->token_matcher->match_Empty), _Var1
          || ((token->matched_type != Token_EOF &&
              (_Var1 = handle_external_error(context,token,context->token_matcher->match_Comment),
              _Var1)))))) goto LAB_0011e95a;
    }
    _Var1 = match_TagLine(context,token);
    if (!_Var1) {
      _Var1 = false;
LAB_0011e9e8:
      TokenQueue_extend(context->token_queue,token_queue);
      return _Var1;
    }
  } while( true );
}

Assistant:

static bool lookahead_0(ParserContext* context) {
    Token* token = 0;
    TokenQueue* queue = TokenQueue_new();
    bool match = false;
    while (true) {
        token = read_token(context);
        TokenQueue_add(queue, token);

        if (match_ScenarioLine(context, token) || false) {
            match = true;
            break;
        }

        if (!(match_Empty(context, token) || match_Comment(context, token) || match_TagLine(context, token) || false)) {
            break;
        } 
    }

    TokenQueue_extend(context->token_queue, queue);

    return match;
}